

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

bool __thiscall CGL::SceneObjects::Sphere::intersect(Sphere *this,Ray *r,Intersection *i)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  double t1;
  double t2;
  double local_90;
  undefined1 local_88 [16];
  double local_70;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_68;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_48;
  
  bVar2 = test(this,r,&local_90,&local_70);
  if (bVar2) {
    local_88._8_8_ = local_90;
    local_88._0_8_ = local_90;
    dVar1 = (double)vmovlps_avx(local_88);
    r->max_t = dVar1;
    iVar3 = (*(this->super_Primitive)._vptr_Primitive[3])(this);
    i->bsdf = (BSDF *)CONCAT44(extraout_var,iVar3);
    i->primitive = &this->super_Primitive;
    dVar1 = (double)vmovlpd_avx(local_88);
    i->t = dVar1;
    local_68.field_0.x = local_88._0_8_ * (r->d).field_0.field_0.x + (r->o).field_0.field_0.x;
    local_68.field_0.y = local_88._8_8_ * (r->d).field_0.field_0.y + (r->o).field_0.field_0.y;
    local_68.field_0.z = local_88._0_8_ * (r->d).field_0.field_0.z + (r->o).field_0.field_0.z;
    normal((Vector3D *)&local_48.field_0,this,(Vector3D *)&local_68.field_0);
    (i->n).field_0.field_0.x = local_48.field_0.x;
    (i->n).field_0.field_0.y = local_48.field_0.y;
    (i->n).field_0.field_0.z = local_48.field_0.z;
    *(undefined8 *)((long)&(i->n).field_0 + 0x18) = local_48._24_8_;
  }
  return bVar2;
}

Assistant:

bool Sphere::intersect(const Ray &r, Intersection *i) const {

  // TODO (Part 1.4):
  // Implement ray - sphere intersection.
  // Note again that you might want to use the the Sphere::test helper here.
  // When an intersection takes place, the Intersection data should be updated
  // correspondingly.
  double t1, t2;
  if (! test(r, t1, t2) ) {
    return false;
  }

  r.max_t = t1;

  // populate isect
  i->bsdf = this->get_bsdf();
  i->primitive = this;
  i->t = t1;

  // get normal vector and save to isect
  Vector3D isect_p = r.o + t1 * r.d;
  i->n = this->normal(isect_p);

  return true;
}